

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDFace::MarkedVertexCount(ON_SubDFace *this)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  long lVar5;
  ON_SubDEdgePtr *pOVar6;
  
  if (this->m_edge_count == 0) {
    uVar3 = 0;
  }
  else {
    pOVar6 = this->m_edge4;
    uVar3 = 0;
    uVar4 = 0;
    do {
      if ((uVar4 == 4) && (pOVar6 = this->m_edgex, pOVar6 == (ON_SubDEdgePtr *)0x0)) {
        return uVar3;
      }
      uVar2 = pOVar6->m_ptr & 0xfffffffffffffff8;
      if (uVar2 == 0) {
        lVar5 = 0;
      }
      else {
        lVar5 = *(long *)(uVar2 + 0x80 + (ulong)((uint)pOVar6->m_ptr & 1) * 8);
      }
      if (lVar5 != 0) {
        bVar1 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar5 + 0x10));
        uVar3 = uVar3 + bVar1;
      }
      uVar4 = uVar4 + 1;
      pOVar6 = pOVar6 + 1;
    } while (uVar4 < this->m_edge_count);
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDFace::MarkedVertexCount() const
{
  unsigned int marked_vertex_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++ eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDVertex* v = eptr->RelativeVertex(0);
    if (nullptr != v && v->m_status.RuntimeMark())
      ++marked_vertex_count;
  }
  return marked_vertex_count;
}